

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall cmCTestTestHandler::UpdateMaxTestNameWidth(cmCTestTestHandler *this)

{
  ulong uVar1;
  int iVar2;
  cmCTestTestProperties *p;
  pointer pcVar3;
  ulong uVar4;
  
  iVar2 = cmCTest::GetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest);
  uVar1 = (long)iVar2;
  for (pcVar3 = (this->TestList).
                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 != (this->TestList).
                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                ._M_impl.super__Vector_impl_data._M_finish; pcVar3 = pcVar3 + 1) {
    uVar4 = (pcVar3->Name)._M_string_length;
    if (uVar4 < uVar1) {
      uVar4 = uVar1;
    }
    uVar1 = uVar4;
  }
  iVar2 = cmCTest::GetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest);
  if (uVar1 == (long)iVar2) {
    return;
  }
  cmCTest::SetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest,(int)uVar1);
  return;
}

Assistant:

void cmCTestTestHandler::UpdateMaxTestNameWidth()
{
  std::string::size_type max = this->CTest->GetMaxTestNameWidth();
  for (cmCTestTestProperties& p : this->TestList) {
    if (max < p.Name.size()) {
      max = p.Name.size();
    }
  }
  if (static_cast<std::string::size_type>(
        this->CTest->GetMaxTestNameWidth()) != max) {
    this->CTest->SetMaxTestNameWidth(static_cast<int>(max));
  }
}